

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

void rasterizeTriangle(Vec3f *points,Vec3f *norms,Vec2f *text,
                      vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                      vector<float,_std::allocator<float>_> *zBuffer)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int y;
  int x;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec3f barycenter;
  
  fVar1 = points->x;
  fVar2 = points[1].x;
  fVar3 = points[2].x;
  fVar9 = fVar3;
  if (fVar2 <= fVar3) {
    fVar9 = fVar2;
  }
  if (fVar1 <= fVar9) {
    fVar9 = fVar1;
  }
  fVar8 = fVar3;
  if (fVar3 <= fVar2) {
    fVar8 = fVar2;
  }
  if (fVar8 <= fVar1) {
    fVar8 = fVar1;
  }
  if ((int)fVar9 <= (int)fVar8) {
    fVar4 = points->y;
    fVar5 = points[1].y;
    fVar6 = points[2].y;
    fVar11 = fVar6;
    if (fVar5 <= fVar6) {
      fVar11 = fVar5;
    }
    fVar10 = fVar6;
    if (fVar6 <= fVar5) {
      fVar10 = fVar5;
    }
    if (fVar4 <= fVar11) {
      fVar11 = fVar4;
    }
    if (fVar10 <= fVar4) {
      fVar10 = fVar4;
    }
    fVar13 = (fVar2 - fVar1) * (fVar6 - fVar4) - (fVar5 - fVar4) * (fVar3 - fVar1);
    x = (int)fVar9;
    do {
      if ((int)fVar11 <= (int)fVar10) {
        y = (int)fVar11;
        do {
          fVar9 = (fVar3 - fVar1) * (fVar4 - (float)y) + -(fVar1 - (float)x) * (fVar6 - fVar4);
          fVar12 = (fVar1 - (float)x) * (fVar5 - fVar4) + (fVar4 - (float)y) * -(fVar2 - fVar1);
          barycenter.x = 1.0 - (fVar9 + fVar12) / fVar13;
          barycenter.y = fVar9 / fVar13;
          barycenter.z = fVar12 / fVar13;
          if (((0.0 < barycenter.z) && (0.0 < barycenter.y)) && (0.0 < barycenter.x)) {
            updateZBuffer(x,y,points,text,norms,&barycenter,framebuffer,zBuffer);
          }
          y = y + 1;
        } while ((int)fVar10 + 1 != y);
      }
      bVar7 = x != (int)fVar8;
      x = x + 1;
    } while (bVar7);
  }
  return;
}

Assistant:

void rasterizeTriangle(Vec3f points[], const Vec3f norms[], Vec2f text[], std::vector<Vec3f> &framebuffer,
                       std::vector<float> &zBuffer) {
    Vec3f A, B, C, P, AB, AC, PA, barycenter;
    int minX, maxX, minY, maxY;

    A = points[0];
    B = points[1];
    C = points[2];

    AB = Vec3f(
        B.x - A.x,
        B.y - A.y,
        B.z - A.z
    );

    AC = Vec3f(
            C.x - A.x,
            C.y - A.y,
            C.z - A.z
    );

    // finding bounding box
    minX = std::min(A.x, std::min(B.x, C.x));
    maxX = std::max(A.x, std::max(B.x, C.x));
    minY = std::min(A.y, std::min(B.y, C.y));
    maxY = std::max(A.y, std::max(B.y, C.y));

    // iterating on bounding box
    for(int x = minX; x <= maxX; x++){
        for(int y = minY; y <= maxY; y++){
            P = Vec3f(x, y, 1);
            PA = Vec3f(
                    A.x - P.x,
                    A.y - P.y,
                    A.z - P.z
            );
            barycenter = getBarycentricCoordinates(AB, AC, PA);
            // checking if inside triangle and update z-buffer
            if(barycenter.x > 0 && barycenter.y > 0 && barycenter.z > 0){
                updateZBuffer(x, y, points, text, norms, barycenter, framebuffer, zBuffer);
            }
        }
    }
}